

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
index_key_value<jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,unsigned_long&>
          (index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           *this,key_type *Name,int64_t Index,byte_string_arg_t *args,byte_string_view *args_1,
          unsigned_long *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pointer phVar4;
  allocator<char> local_19;
  
  *(index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
    **)this = this + 0x10;
  pcVar2 = (Name->_M_dataplus)._M_p;
  paVar1 = &Name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&Name->field_2 + 8);
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x18) = uVar3;
  }
  else {
    *(pointer *)this = pcVar2;
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 8) = Name->_M_string_length;
  (Name->_M_dataplus)._M_p = (pointer)paVar1;
  Name->_M_string_length = 0;
  (Name->field_2)._M_local_buf[0] = '\0';
  *(int64_t *)(this + 0x20) = Index;
  phVar4 = utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::create
                     (args_1->data_,args_1->size_,*args_2,&local_19);
  *(undefined2 *)(this + 0x28) = 0x120c;
  *(pointer *)(this + 0x30) = phVar4;
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }